

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkRef.hpp
# Opt level: O1

Checked<vk::VkDevice_s_*> vk::refdetails::check<vk::VkDevice_s*>(VkDevice_s *object)

{
  TestError *this;
  char *__s;
  long *plVar1;
  long *plVar2;
  allocator<char> local_61;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40 [32];
  
  if (object != (VkDevice_s *)0x0) {
    return (Checked<vk::VkDevice_s_*>)object;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  __s = getTypeName<vk::VkDevice_s*>();
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_61);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  tcu::TestError::TestError
            (this,"Object check() failed",(char *)local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkRef.hpp"
             ,0x35);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

inline Checked<T> check (T object)
{
	if (!object)
		throw tcu::TestError("Object check() failed", (std::string(getTypeName<T>()) + " = 0").c_str(), __FILE__, __LINE__);
	return Checked<T>(object);
}